

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizerDiscardTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::RasterizerDiscardCase::iterate(RasterizerDiscardCase *this)

{
  Random *rnd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream *poVar2;
  TextureFormat this_00;
  RenderContext *context;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  GLenum GVar6;
  RenderTarget *pRVar7;
  long *plVar8;
  undefined8 *puVar9;
  RenderTarget *pRVar10;
  TestLog *pTVar11;
  int iVar12;
  size_type *psVar13;
  ulong *puVar14;
  Surface *surface;
  undefined1 *value;
  void *__buf;
  IterateResult IVar15;
  GLsizei count;
  long lVar16;
  undefined8 uVar17;
  char *pcVar18;
  GLbitfield mask;
  int iVar19;
  ulong uVar20;
  int iVar21;
  deUint32 mode;
  uint uVar22;
  float fVar23;
  vector<float,_std::allocator<float>_> vertices;
  Surface pixels;
  string header;
  string local_270;
  GLint local_24c;
  vector<float,_std::allocator<float>_> local_248;
  Surface local_230;
  string local_210;
  string local_1f0;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0 [2];
  undefined1 local_1b0 [32];
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  this_00 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_24c = glwGetUniformLocation((this->m_program->m_program).m_program,"u_color");
  local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar12 = this->m_iterNdx;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,iVar12 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,0xb1334d);
  psVar13 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_210.field_2._M_allocated_capacity = *psVar13;
    local_210.field_2._8_8_ = plVar8[3];
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  }
  else {
    local_210.field_2._M_allocated_capacity = *psVar13;
    local_210._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_210._M_string_length = plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_210);
  paVar1 = &local_270.field_2;
  puVar14 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar14) {
    local_270.field_2._M_allocated_capacity = *puVar14;
    local_270.field_2._8_8_ = plVar8[3];
    local_270._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_270.field_2._M_allocated_capacity = *puVar14;
    local_270._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_270._M_string_length = plVar8[1];
  *plVar8 = (long)puVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  uVar17 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar1) {
    uVar17 = local_270.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar17 < local_1c8 + local_270._M_string_length) {
    uVar20 = 0xf;
    if (local_1d0 != local_1c0) {
      uVar20 = local_1c0[0];
    }
    if (uVar20 < local_1c8 + local_270._M_string_length) goto LAB_005951cf;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_1d0,0,(char *)0x0,(ulong)local_270._M_dataplus._M_p);
  }
  else {
LAB_005951cf:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_1d0);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  psVar13 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_1f0.field_2._M_allocated_capacity = *psVar13;
    local_1f0.field_2._8_8_ = puVar9[3];
  }
  else {
    local_1f0.field_2._M_allocated_capacity = *psVar13;
    local_1f0._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_1f0._M_string_length = puVar9[1];
  *puVar9 = psVar13;
  puVar9[1] = 0;
  *(undefined1 *)psVar13 = 0;
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar1) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((size_t *)CONCAT44(local_230.m_height,local_230.m_width) != &local_230.m_pixels.m_cap) {
    operator_delete((undefined1 *)CONCAT44(local_230.m_height,local_230.m_width),
                    local_230.m_pixels.m_cap + 1);
  }
  tcu::LogSection::LogSection((LogSection *)local_1b0,&local_1f0,&local_1f0);
  tcu::TestLog::startSection((TestLog *)this_00,(char *)local_1b0._0_8_,local_190._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  if ((this->m_caseOptions & 1) != 0) {
    setupFramebufferObject(this);
  }
  if ((this->m_caseOptions & 2) != 0) {
    glwEnable(0xc11);
    glwScissor(0,0,pRVar7->m_width,pRVar7->m_height);
    poVar2 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = this_00;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Scissor test enabled: glScissor(0, 0, ",0x26);
    std::ostream::operator<<(poVar2,pRVar7->m_width);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
    std::ostream::operator<<(poVar2,pRVar7->m_height);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
  }
  glwUseProgram((this->m_program->m_program).m_program);
  glwEnable(0xb71);
  glwDepthRangef(0.0,1.0);
  glwDepthFunc(0x203);
  glwEnable(0xb90);
  glwStencilFunc(0x205,1,0xff);
  glwStencilOp(0x1e01,0x1e00,0x1e00);
  glwClearColor(0.0,0.0,0.5,1.0);
  glwClearDepthf(1.0);
  glwClearStencil(0);
  glwClear(0x4500);
  glwEnableVertexAttribArray(0);
  if (this->m_drawMode < 7) {
    uVar22 = this->m_numPrimitives;
    switch(this->m_drawMode) {
    case 0:
      break;
    case 1:
      uVar22 = uVar22 * 2;
      break;
    default:
      uVar22 = uVar22 + 2;
      break;
    case 3:
      uVar22 = uVar22 + 1;
      break;
    case 4:
      uVar22 = uVar22 * 3;
    }
  }
  else {
    uVar22 = 0;
  }
  std::vector<float,_std::allocator<float>_>::resize(&local_248,(long)(int)(uVar22 * 4));
  if (0 < (int)uVar22) {
    rnd = &this->m_rnd;
    lVar16 = 0;
    do {
      fVar23 = deRandom_getFloat(&rnd->m_rnd);
      iVar12 = (int)lVar16;
      local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar12] = fVar23 + fVar23 + -1.0;
      fVar23 = deRandom_getFloat(&rnd->m_rnd);
      local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar12 + 1] = fVar23 + fVar23 + -1.0;
      fVar23 = deRandom_getFloat(&rnd->m_rnd);
      local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar12 + 2] = fVar23 * 0.79999995 + 0.1;
      local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar12 + 3] = 1.0;
      lVar16 = lVar16 + 4;
    } while ((ulong)uVar22 << 2 != lVar16);
  }
  glwVertexAttribPointer
            (0,4,0x1406,'\0',0,
             local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (this->m_caseType - CASE_CLEAR_DEPTH < 2) {
    glwClearColor(0.0,0.0,0.0,1.0);
    glwClear(0x4000);
  }
  glwUniform4f(local_24c,1.0,0.0,0.0,1.0);
  glwClearColor(1.0,0.0,0.0,1.0);
  glwClearDepthf(0.0);
  glwClearStencil(1);
  glwEnable(0x8c89);
  GVar6 = glwGetError();
  glu::checkError(GVar6,"Rasterizer discard enabled",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fRasterizerDiscardTests.cpp"
                  ,0x148);
  switch(this->m_caseType) {
  case CASE_WRITE_DEPTH:
  case CASE_WRITE_STENCIL:
    iVar12 = (int)((ulong)((long)local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                          (long)local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2);
    iVar19 = iVar12 + 3;
    if (-1 < iVar12) {
      iVar19 = iVar12;
    }
    glwDrawArrays(this->m_drawMode,0,iVar19 >> 2);
    break;
  case CASE_CLEAR_COLOR:
    mask = 0x4000;
    if ((this->m_caseOptions & 1) == 0) goto LAB_005956c6;
    value = FAIL_COLOR_RED;
    GVar6 = 0x1800;
LAB_005956d9:
    glwClearBufferfv(GVar6,0,(GLfloat *)value);
    break;
  case CASE_CLEAR_DEPTH:
    mask = 0x100;
    if ((this->m_caseOptions & 1) != 0) {
      value = (undefined1 *)&FAIL_DEPTH;
      GVar6 = 0x1801;
      goto LAB_005956d9;
    }
LAB_005956c6:
    glwClear(mask);
    break;
  case CASE_CLEAR_STENCIL:
    mask = 0x400;
    if ((this->m_caseOptions & 1) == 0) goto LAB_005956c6;
    glwClearBufferiv(0x1802,0,&FAIL_STENCIL);
  }
  glwDisable(0x8c89);
  GVar6 = glwGetError();
  glu::checkError(GVar6,"Rasterizer discard disabled",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fRasterizerDiscardTests.cpp"
                  ,0x159);
  if (this->m_caseType - CASE_CLEAR_DEPTH < 2) {
    glwUniform4f(local_24c,0.0,0.0,0.5,1.0);
    mode = this->m_drawMode;
    iVar12 = (int)((ulong)((long)local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                          (long)local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2);
    iVar19 = iVar12 + 3;
    if (-1 < iVar12) {
      iVar19 = iVar12;
    }
    count = iVar19 >> 2;
  }
  else {
    if ((this->m_caseType != CASE_WRITE_STENCIL) ||
       (((this->m_caseOptions & 1) == 0 &&
        (pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context),
        pRVar10->m_stencilBits < 1)))) goto LAB_005957ba;
    count = 4;
    glwVertexAttribPointer(0,4,0x1406,'\0',0,UNIT_SQUARE);
    mode = 5;
    glwStencilFunc(0x202,1,0xff);
  }
  glwDrawArrays(mode,0,count);
LAB_005957ba:
  glwFinish();
  glwDisable(0xb90);
  glwDisable(0xb71);
  glwDisable(0xc11);
  tcu::Surface::Surface(&local_230,pRVar7->m_width,pRVar7->m_height);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_270._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_230.m_pixels.m_cap != (void *)0x0) {
    local_230.m_pixels.m_cap = (size_t)local_230.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_270,local_230.m_width,
             local_230.m_height,1,(void *)local_230.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
  iVar12 = 0;
  if (local_230.m_height < 1) {
    bVar3 = false;
  }
  else {
    iVar19 = 0;
    bVar3 = false;
    bVar5 = 0;
    bVar4 = 0;
    do {
      uVar20 = (ulong)(uint)local_230.m_width;
      iVar21 = iVar12;
      if (0 < local_230.m_width) {
        do {
          bVar4 = bVar5;
          uVar22 = *(uint *)((long)local_230.m_pixels.m_ptr + (long)iVar21 * 4);
          if ((uVar22 & 0xff0000) != 0) {
            bVar4 = 1;
          }
          bVar5 = bVar4;
          if ((char)uVar22 != '\0') {
            bVar3 = true;
            break;
          }
          iVar21 = iVar21 + 1;
          uVar20 = uVar20 - 1;
        } while (uVar20 != 0);
      }
      if (bVar3) break;
      iVar19 = iVar19 + 1;
      iVar12 = iVar12 + local_230.m_width;
    } while (iVar19 != local_230.m_height);
    bVar3 = (bool)(bVar4 & (bVar3 ^ 1U));
  }
  if ((this->m_caseOptions & 1) != 0) {
    deleteFramebufferObject(this);
  }
  if (!bVar3) {
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Result image","");
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Result image","");
    surface = &local_230;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_270,&local_210,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b0,this_00.order,__buf,(size_t)surface);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
  }
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Test result: ",0xd);
  pcVar18 = "Failed!";
  if (bVar3) {
    pcVar18 = "Passed!";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,pcVar18,7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  poVar2 = (ostringstream *)(local_1b0 + 8);
  if (bVar3) {
    local_1b0._0_8_ = this_00;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Primitive or buffer clear was discarded correctly.",0x32);
    pTVar11 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::TestLog::endSection(pTVar11);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    uVar22 = this->m_iterNdx;
    this->m_iterNdx = uVar22 + 1;
    IVar15 = (IterateResult)(0x7ffffffe < uVar22);
  }
  else {
    local_1b0._0_8_ = this_00;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Primitive or buffer clear was not discarded.",0x2c);
    pTVar11 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::TestLog::endSection(pTVar11);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    IVar15 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  tcu::Surface::~Surface(&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return IVar15;
}

Assistant:

RasterizerDiscardCase::IterateResult RasterizerDiscardCase::iterate (void)
{
	TestLog&					log				= m_testCtx.getLog();
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderTarget();
	deUint32					colorUnif		= glGetUniformLocation(m_program->getProgram(), "u_color");
	bool						failColorFound	= false;
	bool						passColorFound	= false;
	std::vector<float>			vertices;

	std::string header = "Case iteration " + de::toString(m_iterNdx+1) + " / " + de::toString(NUM_CASE_ITERATIONS);
	log << TestLog::Section(header, header);

	DE_ASSERT (m_program);

	// Create and bind FBO if needed

	if (m_caseOptions & CASEOPTION_FBO)
	{
		try
		{
			setupFramebufferObject();
		}
		catch (tcu::NotSupportedError& e)
		{
			log << TestLog::Message << "ERROR: " << e.what() << "." << TestLog::EndMessage << TestLog::EndSection;
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
			return STOP;
		}
		catch (tcu::InternalError& e)
		{
			log << TestLog::Message << "ERROR: " << e.what() << "." << TestLog::EndMessage << TestLog::EndSection;
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
			return STOP;
		}
	}

	if (m_caseOptions & CASEOPTION_SCISSOR)
	{
		glEnable (GL_SCISSOR_TEST);
		glScissor(0, 0, renderTarget.getWidth(), renderTarget.getHeight());
		log << TestLog::Message << "Scissor test enabled: glScissor(0, 0, " << renderTarget.getWidth() << ", " << renderTarget.getHeight() << ")" << TestLog::EndMessage;
	}

	glUseProgram	(m_program->getProgram());

	glEnable		(GL_DEPTH_TEST);
	glDepthRangef	(0.0f, 1.0f);
	glDepthFunc		(GL_LEQUAL);

	glEnable		(GL_STENCIL_TEST);
	glStencilFunc	(GL_NOTEQUAL, 1, 0xFF);
	glStencilOp		(GL_REPLACE, GL_KEEP, GL_KEEP);

	glClearColor	(PASS_COLOR_BLUE.x(), PASS_COLOR_BLUE.y(), PASS_COLOR_BLUE.z(), PASS_COLOR_BLUE.w());
	glClearDepthf	(1.0f);
	glClearStencil	(0);
	glClear			(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);

	// Generate vertices

	glEnableVertexAttribArray (0);
	generateVertices		  (vertices, m_numPrimitives, m_rnd, m_drawMode);
	glVertexAttribPointer	  (0, 4, GL_FLOAT, GL_FALSE, 0, &vertices[0]);

	// Clear color to black for depth and stencil clear cases

	if (m_caseType == CASE_CLEAR_DEPTH || m_caseType == CASE_CLEAR_STENCIL)
	{
		glClearColor	(BLACK_COLOR.x(), BLACK_COLOR.y(), BLACK_COLOR.z(), BLACK_COLOR.w());
		glClear			(GL_COLOR_BUFFER_BIT);
	}

	// Set fail values for color, depth and stencil

	glUniform4f		(colorUnif, FAIL_COLOR_RED.x(), FAIL_COLOR_RED.y(), FAIL_COLOR_RED.z(), FAIL_COLOR_RED.w());
	glClearColor	(FAIL_COLOR_RED.x(), FAIL_COLOR_RED.y(), FAIL_COLOR_RED.z(), FAIL_COLOR_RED.w());
	glClearDepthf	(FAIL_DEPTH);
	glClearStencil	(FAIL_STENCIL);

	// Enable rasterizer discard

	glEnable		(GL_RASTERIZER_DISCARD);
	GLU_CHECK_MSG	("Rasterizer discard enabled");

	// Do to-be-discarded primitive draws and buffer clears

	switch (m_caseType)
	{
		case CASE_WRITE_DEPTH:			glDrawArrays(m_drawMode, 0, (int)vertices.size() / 4);																	break;
		case CASE_WRITE_STENCIL:		glDrawArrays(m_drawMode, 0, (int)vertices.size() / 4);																	break;
		case CASE_CLEAR_COLOR:			(m_caseOptions & CASEOPTION_FBO) ? glClearBufferfv(GL_COLOR, 0, &FAIL_COLOR_RED[0])	: glClear(GL_COLOR_BUFFER_BIT);		break;
		case CASE_CLEAR_DEPTH:			(m_caseOptions & CASEOPTION_FBO) ? glClearBufferfv(GL_DEPTH, 0, &FAIL_DEPTH)		: glClear(GL_DEPTH_BUFFER_BIT);		break;
		case CASE_CLEAR_STENCIL:		(m_caseOptions & CASEOPTION_FBO) ? glClearBufferiv(GL_STENCIL, 0, &FAIL_STENCIL)	: glClear(GL_STENCIL_BUFFER_BIT);	break;
		default:						DE_ASSERT(false);
	}

	// Disable rasterizer discard

	glDisable		(GL_RASTERIZER_DISCARD);
	GLU_CHECK_MSG	("Rasterizer discard disabled");

	if (m_caseType == CASE_WRITE_STENCIL)
	{
		if ((m_caseOptions & CASEOPTION_FBO) || m_context.getRenderTarget().getStencilBits() > 0)
		{
			// Draw a full-screen square that colors all pixels red if they have stencil value 1.

			glVertexAttribPointer (0, 4, GL_FLOAT, GL_FALSE, 0, &UNIT_SQUARE[0]);
			glStencilFunc		  (GL_EQUAL, 1, 0xFF);
			glDrawArrays		  (GL_TRIANGLE_STRIP, 0, 4);
		}
		// \note If no stencil buffers are present and test is rendering to default framebuffer, test will always pass.
	}
	else if (m_caseType == CASE_CLEAR_DEPTH || m_caseType == CASE_CLEAR_STENCIL)
	{
		// Draw pass-indicating primitives for depth and stencil clear cases

		glUniform4f	 (colorUnif, PASS_COLOR_BLUE.x(), PASS_COLOR_BLUE.y(), PASS_COLOR_BLUE.z(), PASS_COLOR_BLUE.w());
		glDrawArrays (m_drawMode, 0, (int)vertices.size() / 4);
	}

	glFinish  ();
	glDisable (GL_STENCIL_TEST);
	glDisable (GL_DEPTH_TEST);
	glDisable (GL_SCISSOR_TEST);

	// Read and check pixel data

	tcu::Surface pixels(renderTarget.getWidth(), renderTarget.getHeight());
	glu::readPixels(m_context.getRenderContext(), 0, 0, pixels.getAccess());

	{
		int width = pixels.getWidth();
		int height = pixels.getHeight();

		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				if (pixels.getPixel(x,y).getBlue() != 0)
					passColorFound = true;

				if (pixels.getPixel(x,y).getRed() != 0)
				{
					failColorFound = true;
					break;
				}
			}
			if (failColorFound) break;
		}
	}

	// Delete FBO if created

	if (m_caseOptions & CASEOPTION_FBO)
		deleteFramebufferObject();

	// Evaluate test result

	bool testOk = passColorFound && !failColorFound;

	if (!testOk)
		log << TestLog::Image ("Result image", "Result image", pixels);
	log << TestLog::Message << "Test result: " << (testOk ? "Passed!" : "Failed!") << TestLog::EndMessage;

	if (!testOk)
	{
		log << TestLog::Message << "Primitive or buffer clear was not discarded." << TestLog::EndMessage << TestLog::EndSection;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	log << TestLog::Message << "Primitive or buffer clear was discarded correctly." << TestLog::EndMessage << TestLog::EndSection;

	return (++m_iterNdx < NUM_CASE_ITERATIONS) ? CONTINUE : STOP;
}